

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ESOINN.cpp
# Opt level: O2

void __thiscall soinn::ESOINN::classify(ESOINN *this)

{
  StoredVertexList *pSVar1;
  value_type vVar2;
  _List_node_base *p_Var3;
  mapped_type *pmVar4;
  _List_node_base *p_Var5;
  _List_node_base *p_Var6;
  vertex_descriptor v;
  ComponentMap component;
  _List_node_base *local_58;
  _Rb_tree<void_*,_std::pair<void_*const,_int>,_std::_Select1st<std::pair<void_*const,_int>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>
  local_50;
  
  deleteNoiseVertex(this);
  pSVar1 = &(this->graph).super_type.m_vertices;
  p_Var3 = (_List_node_base *)0x0;
  p_Var5 = (this->graph).super_type.m_vertices.super__List_base<void_*,_std::allocator<void_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var6 = p_Var5, p_Var5 != (_List_node_base *)pSVar1) {
    for (; p_Var5 = (_List_node_base *)pSVar1, p_Var6 != (_List_node_base *)pSVar1;
        p_Var6 = (((_List_base<void_*,_std::allocator<void_*>_> *)&p_Var6->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next) {
      *(_List_node_base **)((long)(p_Var6[1]._M_next + 1) + 8) = p_Var3;
      p_Var3 = (_List_node_base *)((long)&p_Var3->_M_next + 1);
    }
  }
  local_50._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_50._M_impl.super__Rb_tree_header._M_header;
  local_50._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_50._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_50._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_50._M_impl.super__Rb_tree_header._M_header._M_right =
       local_50._M_impl.super__Rb_tree_header._M_header._M_left;
  vVar2 = boost::
          connected_components<boost::adjacency_list<boost::listS,boost::listS,boost::undirectedS,boost::property<boost::vertex_index_t,unsigned_long,soinn::VertexProperties>,soinn::EdgeProperties,boost::no_property,boost::listS>,boost::associative_property_map<std::map<void*,int,std::less<void*>,std::allocator<std::pair<void*const,int>>>>>
                    (&this->graph,&local_50);
  this->numberOfClasses = vVar2;
  p_Var5 = (this->graph).super_type.m_vertices.super__List_base<void_*,_std::allocator<void_*>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  while (p_Var3 = p_Var5, p_Var5 != (_List_node_base *)pSVar1) {
    for (; p_Var5 = (_List_node_base *)pSVar1, p_Var3 != (_List_node_base *)pSVar1;
        p_Var3 = (((_List_base<void_*,_std::allocator<void_*>_> *)&p_Var3->_M_next)->_M_impl).
                 _M_node.super__List_node_base._M_next) {
      local_58 = p_Var3[1]._M_next;
      pmVar4 = std::
               map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>::
               operator[]((map<void_*,_int,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>
                           *)&local_50,&local_58);
      *(mapped_type *)((long)(local_58 + 3) + 8) = *pmVar4;
    }
  }
  std::
  _Rb_tree<void_*,_std::pair<void_*const,_int>,_std::_Select1st<std::pair<void_*const,_int>_>,_std::less<void_*>,_std::allocator<std::pair<void_*const,_int>_>_>
  ::~_Rb_tree(&local_50);
  return;
}

Assistant:

void ESOINN::classify()
{
    deleteNoiseVertex();
    size_t index = 0;
    BGL_FORALL_VERTICES(v, graph, Graph)
    {
        boost::put(boost::vertex_index, graph, v, index++);
    }
    ComponentMap component;
    boost::associative_property_map<ComponentMap> componentMap(component);
    numberOfClasses = connected_components(graph, componentMap);
    BGL_FORALL_VERTICES(v, graph, Graph)
    {
        graph[v].classId = boost::get(componentMap, v);
    }
}